

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O2

shared_ptr<spdlog::logger> __thiscall
spdlog::
create<spdlog::sinks::rotating_file_sink<std::mutex>,std::__cxx11::string,unsigned_long,unsigned_long>
          (spdlog *this,string *logger_name,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long args_1,unsigned_long args_2)

{
  registry_t<std::mutex> *logger_name_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar1;
  sinks_init_list sinks;
  undefined1 local_58 [32];
  unsigned_long args_local_1;
  unsigned_long args_local;
  
  args_local_1 = args_2;
  args_local = args_1;
  std::
  make_shared<spdlog::sinks::rotating_file_sink<std::mutex>,std::__cxx11::string&,unsigned_long&,unsigned_long&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (unsigned_long *)args,&args_local);
  local_58._16_8_ = local_58._0_8_;
  local_58._24_8_ = local_58._8_8_;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  logger_name_00 = details::registry_t<std::mutex>::instance();
  std::__shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2> *)local_58,
             (__shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10));
  sinks._M_len = (size_type)local_58;
  sinks._M_array = (iterator)logger_name;
  details::registry_t<std::mutex>::create
            ((registry_t<std::mutex> *)this,(string *)logger_name_00,sinks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x18));
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}